

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_spt(CPUS390XState_conflict *env,uint64_t time)

{
  uint64_t uVar1;
  int64_t iVar2;
  uint64_t time_local;
  CPUS390XState_conflict *env_local;
  
  if (time != 0xffffffffffffffff) {
    uVar1 = tod2time(time);
    iVar2 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
    env->cputm = iVar2 + uVar1;
  }
  return;
}

Assistant:

void HELPER(spt)(CPUS390XState *env, uint64_t time)
{
    if (time == -1ULL) {
        return;
    }

    /* nanoseconds */
    time = tod2time(time);

    env->cputm = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL) + time;

    // timer_mod(env->cpu_timer, env->cputm);
}